

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link-test.cpp
# Opt level: O3

void verify_msg(msg_t read_msg,char *portname,int value,char *test_id,int line)

{
  char *b;
  rtosc_arg_t rVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string test_string;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,test_id,(allocator<char> *)local_70);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,local_50,local_48 + (long)local_50);
  std::__cxx11::string::append((char *)local_70);
  assert_str_eq(portname,read_msg,(char *)local_70[0],line);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  b = rtosc_argument_string(read_msg);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,local_50,local_48 + (long)local_50);
  std::__cxx11::string::append((char *)local_70);
  assert_str_eq("i",b,(char *)local_70[0],line);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((*b == 'i') && (b[1] == '\0')) {
    rVar1 = rtosc_argument(read_msg,0);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>((string *)local_70,local_50,local_48 + (long)local_50)
    ;
    std::__cxx11::string::append((char *)local_70);
    assert_int_eq(value,rVar1.i,(char *)local_70[0],line);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void verify_msg(rtosc::msg_t read_msg, const char *portname, int value, const char *test_id, int line)
{
    const std::string test_string = test_id;

    assert_str_eq(portname, read_msg, (test_string + " (portname)").c_str(), line);
    const char* arg_str = rtosc_argument_string(read_msg);
    assert_str_eq("i", arg_str, (test_string + " (arg type)").c_str(), line);
    if(!strcmp(arg_str, "i"))
        assert_int_eq(value, rtosc_argument(read_msg, 0).i, (test_string + " (arg value)").c_str(), line);
}